

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
FindNextProperty(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                 *this,ScriptContext *scriptContext,PropertyIndex *index,
                JavascriptString **propertyStringName,PropertyId *propertyId,
                PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
                EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  SimpleDictionaryPropertyDescriptor<unsigned_short> SVar1;
  DynamicTypeHandler *pDVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar3;
  PropertyRecord *pPVar4;
  code *pcVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  BOOL BVar10;
  PropertyId propertyId_00;
  undefined4 *puVar11;
  ScriptContext *pSVar12;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar13;
  PropertyRecord **ppPVar14;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  EnumeratorFlags EVar15;
  PropertyRecord *local_68;
  PropertyRecord *propertyRecord;
  ScriptContext *local_58;
  EnumeratorFlags *local_50;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_44;
  JavascriptString **local_40;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *local_38;
  
  local_58 = scriptContext;
  local_40 = propertyStringName;
  local_38 = this;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x271,"(propertyStringName)","propertyStringName");
    if (!bVar6) goto LAB_00dd530d;
    *puVar11 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x272,"(propertyId)","propertyId");
    if (!bVar6) goto LAB_00dd530d;
    *puVar11 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x273,"(type)","type");
    if (!bVar6) goto LAB_00dd530d;
    *puVar11 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x274,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar6) {
LAB_00dd530d:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar11 = 0;
  }
  local_50 = attributes;
  if ((DynamicType *)type == typeToEnumerate) {
    uVar7 = *index;
    while( true ) {
      pBVar3 = (local_38->propertyMap).ptr;
      if (pBVar3->count - pBVar3->freeCount <= (int)(uint)uVar7) break;
      pSVar13 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetValueAt(pBVar3,(uint)uVar7);
      SVar1 = *pSVar13;
      EVar15 = SVar1.Attributes;
      if ((((uint)SVar1 >> 8 & 0x18) == 0) && (((EVar15 | flags) & EnumNonEnumerable) != None)) {
        ppPVar14 = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetKeyAt((local_38->propertyMap).ptr,(uint)*index);
        pSVar12 = local_58;
        pPVar4 = *ppPVar14;
        if (((flags & EnumSymbols) != None) || (pPVar4->isSymbol == false)) {
          if (local_50 != (EnumeratorFlags *)0x0) {
            *local_50 = EVar15;
          }
          propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_58,pPVar4);
          *propertyId = propertyId_00;
          this_00 = ScriptContext::GetPropertyString(pSVar12,propertyId_00);
          *local_40 = &this_00->super_JavascriptString;
          if (((uint)SVar1 >> 8 & 4) != 0) {
            polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
            propertyRecordUsageCache = PropertyString::GetPropertyRecordUsageCache(this_00);
            PropertyValueInfo::SetCacheInfo
                      (info,(RecyclableObject *)this_00,propertyRecordUsageCache,
                       polymorphicInlineCache,false);
            if (info == (PropertyValueInfo *)0x0) {
              return 1;
            }
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = SVar1.propertyIndex;
            info->m_attributes = EVar15;
            info->flags = InlineCacheNoFlags;
            if (((uint)SVar1 & 6) == 2) {
              return 1;
            }
            *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
            return 1;
          }
          BVar10 = 1;
          if (info == (PropertyValueInfo *)0x0) {
            return 1;
          }
          goto LAB_00dd5211;
        }
      }
      uVar7 = *index + 1;
      *index = uVar7;
    }
    BVar10 = 0;
    if (info != (PropertyValueInfo *)0x0) {
LAB_00dd5211:
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  else {
    pDVar2 = (typeToEnumerate->typeHandler).ptr;
    iVar8 = (*pDVar2->_vptr_DynamicTypeHandler[10])
                      (pDVar2,local_58,index,local_40,propertyId,attributes,typeToEnumerate,
                       typeToEnumerate,(ulong)flags,instance,info);
    if (iVar8 != 0) {
      propertyRecord = (PropertyRecord *)__tls_get_addr(&PTR_01548f08);
      do {
        local_44._0_1_ = 1;
        local_44.Attributes = '\a';
        local_44.propertyIndex = 0xffff;
        if (*propertyId == -1) {
          if (*local_40 != (JavascriptString *)0x0) {
            pBVar3 = (local_38->propertyMap).ptr;
            uVar9 = JsUtil::
                    BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                    ::FindEntryWithKey<Js::JavascriptString*>
                              ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                                *)pBVar3,local_40);
            if (-1 < (int)uVar9) {
              EVar15 = (pBVar3->entries).ptr[uVar9].
                       super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                       .
                       super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                       .
                       super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                       .
                       super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                       .value.Attributes;
              goto LAB_00dd5128;
            }
          }
        }
        else {
          pSVar12 = Js::Type::GetScriptContext(type);
          local_68 = ScriptContext::GetPropertyName(pSVar12,*propertyId);
          if (((flags & EnumSymbols) == None) && (local_68->isSymbol == true)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar4 = propertyRecord;
            *(undefined4 *)
             &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x2b7,
                                        "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                        ,
                                        "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                       );
            if (!bVar6) goto LAB_00dd530d;
            *(undefined4 *)
             &(pPVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 0;
          }
          bVar6 = JsUtil::
                  BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::PropertyRecord_const*>
                            ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                              *)(local_38->propertyMap).ptr,&local_68,&local_44);
          if (bVar6) {
            EVar15 = local_44.Attributes;
LAB_00dd5128:
            if (((EVar15 & (EphemeralReference|UseCache)) == None) &&
               (((EVar15 | flags) & EnumNonEnumerable) != None)) {
              if (local_50 != (EnumeratorFlags *)0x0) {
                *local_50 = EVar15;
              }
              if (info != (PropertyValueInfo *)0x0) {
                info->m_instance = &instance->super_RecyclableObject;
                info->m_propertyIndex = 0xffff;
                info->m_attributes = '\0';
                info->flags = InlineCacheNoFlags;
              }
              return 1;
            }
          }
        }
        *index = *index + 1;
        iVar8 = (*pDVar2->_vptr_DynamicTypeHandler[10])
                          (pDVar2,local_58,index,local_40,propertyId,local_50,typeToEnumerate,
                           typeToEnumerate,(ulong)flags,instance,info);
      } while (iVar8 != 0);
    }
    BVar10 = 0;
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  return BVar10;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    TMapKey key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                    *propertyStringName = propertyString;
                    if (descriptor.Attributes & PropertyWritable)
                    {
                        PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                        SetPropertyValueInfo(info, instance, &descriptor);
                    }
                    else
                    {
                        PropertyValueInfo::SetNoCache(info, instance);
                    }
                    return TRUE;
                }
            }
            PropertyValueInfo::SetNoCache(info, instance);

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }

            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }
                PropertyValueInfo::SetNoCache(info, instance);
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }